

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.hpp
# Opt level: O0

void __thiscall pg::QPTSolver::todo_push(QPTSolver *this,int node)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  undefined1 local_48 [16];
  undefined1 local_38 [28];
  int node_local;
  QPTSolver *this_local;
  uintqueue *local_10;
  
  local_38._20_4_ = node;
  unique0x1000016a = this;
  bitset::operator[]((bitset *)local_38,(size_t)&this->dirty);
  bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_38);
  if (!bVar2) {
    local_10 = &this->todo;
    this_local._4_4_ = local_38._20_4_;
    iVar1 = (this->todo).pointer;
    (this->todo).pointer = iVar1 + 1;
    local_10->queue[iVar1] = local_38._20_4_;
    bitset::operator[]((bitset *)local_48,(size_t)&this->dirty);
    bitset::reference::operator=((reference *)local_48,true);
    if (2 < (this->super_Solver).trace) {
      poVar3 = std::operator<<((this->super_Solver).logger,"push(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_38._20_4_);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void todo_push(int node) {
        if (dirty[node]) return;
        todo.push(node);
        dirty[node] = 1;
#ifndef NDEBUG
        if (trace >= 3) logger << "push(" << node << ")" << std::endl;
#endif
    }